

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
          *heapBucket,SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *next;
  code *pcVar1;
  bool bVar2;
  BucketData<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *pBVar3;
  undefined8 *in_FS_OFFSET;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list;
  BucketData<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *bucketData;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *heapBucket_local;
  RecyclerSweep *this_local;
  
  if ((Js::Configuration::Global[0x2c158] & 1) != 0) {
    pBVar3 = GetBucketData<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                       (this,heapBucket);
    if ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket != heapBucket) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::BackgroundReleasePagesSweep
              ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock,this->recycler);
    next = pBVar3->pendingEmptyBlockList;
    if (next == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      if (pBVar3->pendingEmptyBlockListTail !=
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pBVar3->pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
    }
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock(heapBlock,next);
    pBVar3->pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}